

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O1

void free_symtbl(symtbl_t *s)

{
  ulong uVar1;
  
  if (s->children != (symtbl_t **)0x0) {
    if (s->num_children != 0) {
      uVar1 = 0;
      do {
        free_symtbl(s->children[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < s->num_children);
    }
    free(s->children);
  }
  if (s->syms != (sym_t **)0x0) {
    if (s->num_syms != 0) {
      uVar1 = 0;
      do {
        free(s->syms[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < s->num_syms);
    }
    free(s->syms);
  }
  free(s);
  return;
}

Assistant:

void free_symtbl(symtbl_t* s)
{
    unsigned int i;
    if (s->children)
    {
        for (i = 0; i < s->num_children; i++)
            free_symtbl(s->children[i]);
        free (s->children);
    }

    if (s->syms)
    {
        for (i = 0; i < s->num_syms; i++)
            free(s->syms[i]);
        free(s->syms);
    }

    free(s);
}